

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opnmidi_midiplay.cpp
# Opt level: O2

void __thiscall OPNMIDIplay::partialReset(OPNMIDIplay *this)

{
  int emulator;
  uint uVar1;
  OPN2 *this_00;
  unsigned_long PCM_RATE;
  OPNFamily family;
  OpnChannel OStack_98;
  
  this_00 = (this->m_synth).m_p;
  realTime_panic(this);
  (this->m_setup).tick_skip_samples_delay = 0;
  this_00->m_runAtPcmRate = (this->m_setup).runAtPcmRate;
  emulator = (this->m_setup).emulator;
  PCM_RATE = (this->m_setup).PCM_RATE;
  family = OPN2::chipFamily(this_00);
  OPN2::reset(this_00,emulator,PCM_RATE,family,this);
  std::vector<OPNMIDIplay::OpnChannel,_std::allocator<OPNMIDIplay::OpnChannel>_>::clear
            (&this->m_chipChannels);
  uVar1 = this_00->m_numChannels;
  OpnChannel::OpnChannel(&OStack_98);
  std::vector<OPNMIDIplay::OpnChannel,_std::allocator<OPNMIDIplay::OpnChannel>_>::resize
            (&this->m_chipChannels,(ulong)uVar1,&OStack_98);
  pl_list<OPNMIDIplay::OpnChannel::LocationData>::~pl_list(&OStack_98.users);
  resetMIDIDefaults(this,0);
  return;
}

Assistant:

void OPNMIDIplay::partialReset()
{
    Synth &synth = *m_synth;
    realTime_panic();
    m_setup.tick_skip_samples_delay = 0;
    synth.m_runAtPcmRate = m_setup.runAtPcmRate;
    synth.reset(m_setup.emulator, m_setup.PCM_RATE, synth.chipFamily(), this);
    m_chipChannels.clear();
    m_chipChannels.resize(synth.m_numChannels);
    resetMIDIDefaults();
#if defined(OPNMIDI_MIDI2VGM) && !defined(OPNMIDI_DISABLE_MIDI_SEQUENCER)
    m_sequencerInterface->onloopStart = synth.m_loopStartHook;
    m_sequencerInterface->onloopStart_userData = synth.m_loopStartHookData;
    m_sequencerInterface->onloopEnd = synth.m_loopEndHook;
    m_sequencerInterface->onloopEnd_userData = synth.m_loopEndHookData;
    m_sequencer->setLoopHooksOnly(m_sequencerInterface->onloopStart != NULL);
#endif
}